

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_format.cpp
# Opt level: O2

void __thiscall format_chars_Test::format_chars_Test(format_chars_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00273cb0;
  return;
}

Assistant:

TEST(format, chars)
{
    EXPECT_EQ(ST_LITERAL("xxAxx"), ST::format("xx{c}xx", 'A'));
    EXPECT_EQ(ST_LITERAL("xxAxx"), ST::format("xx{c}xx", (signed char)'A'));
    EXPECT_EQ(ST_LITERAL("xxAxx"), ST::format("xx{c}xx", (unsigned char)'A'));
    EXPECT_EQ(ST_LITERAL("xxAxx"), ST::format("xx{c}xx", u'A'));
    EXPECT_EQ(ST_LITERAL("xxAxx"), ST::format("xx{c}xx", U'A'));

    // UTF-8 encoding of wide (16-bit) char
    EXPECT_EQ(ST_LITERAL("xx\xef\xbf\xbexx"), ST::format("xx{c}xx", L'\ufffe'));
    EXPECT_EQ(ST_LITERAL("xx\xe7\xbf\xbexx"), ST::format("xx{c}xx", (short)0x7ffe));
    EXPECT_EQ(ST_LITERAL("xx\xef\xbf\xbexx"), ST::format("xx{c}xx", (unsigned short)0xfffe));
    EXPECT_EQ(ST_LITERAL("xx\xef\xbf\xbexx"), ST::format("xx{c}xx", u'\ufffe'));

    // UTF-8 encoding of UCS4 (32-bit) char
    EXPECT_EQ(ST_LITERAL("xx\xf4\x8f\xbf\xbfxx"), ST::format("xx{c}xx", (int)0x10ffff));
    EXPECT_EQ(ST_LITERAL("xx\xf4\x8f\xbf\xbfxx"), ST::format("xx{c}xx", (unsigned int)0x10ffff));
    EXPECT_EQ(ST_LITERAL("xx\xf4\x8f\xbf\xbfxx"), ST::format("xx{c}xx", (long)0x10ffff));
    EXPECT_EQ(ST_LITERAL("xx\xf4\x8f\xbf\xbfxx"), ST::format("xx{c}xx", (unsigned long)0x10ffff));
    EXPECT_EQ(ST_LITERAL("xx\xf4\x8f\xbf\xbfxx"), ST::format("xx{c}xx", (long long)0x10ffff));
    EXPECT_EQ(ST_LITERAL("xx\xf4\x8f\xbf\xbfxx"), ST::format("xx{c}xx", (unsigned long long)0x10ffff));
    EXPECT_EQ(ST_LITERAL("xx\xf4\x8f\xbf\xbfxx"), ST::format("xx{c}xx", U'\U0010ffff'));

#ifdef ST_HAVE_CXX20_CHAR8_TYPES
    // Leave UTF-8 code points alone
    EXPECT_EQ(ST_LITERAL("xxAxx"), ST::format("xx{c}xx", u8'A'));
    EXPECT_EQ(ST_LITERAL("xx\xef\xbf\xbexx"), ST::format("xx{c}{c}{c}xx",
              (char8_t)0xef, (char8_t)0xbf, (char8_t)0xbe));
#endif

    // char and wchar_t without the {c} format are now treated as integers!
    // See https://github.com/zrax/string_theory/issues/13 for details
    EXPECT_EQ(ST_LITERAL("xx0xx"), ST::format("xx{}xx", (char)0));
    EXPECT_EQ(ST_LITERAL("xx123xx"), ST::format("xx{}xx", (char)123));
    if (std::numeric_limits<char>::is_signed) {
        EXPECT_EQ(ST_LITERAL("xx-123xx"), ST::format("xx{}xx", (char)-123));
    }
    EXPECT_EQ(ST_LITERAL("xx0xx"), ST::format("xx{}xx", (wchar_t)0));
    EXPECT_EQ(ST_LITERAL("xx123xx"), ST::format("xx{}xx", (wchar_t)123));
    if (std::numeric_limits<wchar_t>::is_signed) {
        EXPECT_EQ(ST_LITERAL("xx-123xx"), ST::format("xx{}xx", (wchar_t)-123));
    }
    EXPECT_EQ(ST_LITERAL("xx0xx"), ST::format("xx{}xx", (char16_t)0));
    EXPECT_EQ(ST_LITERAL("xx123xx"), ST::format("xx{}xx", (char16_t)123));
    EXPECT_EQ(ST_LITERAL("xx0xx"), ST::format("xx{}xx", (char32_t)0));
    EXPECT_EQ(ST_LITERAL("xx123xx"), ST::format("xx{}xx", (char32_t)123));

#ifdef ST_HAVE_CXX20_CHAR8_TYPES
    EXPECT_EQ(ST_LITERAL("xx0xx"), ST::format("xx{}xx", (char8_t)0));
    EXPECT_EQ(ST_LITERAL("xx123xx"), ST::format("xx{}xx", (char8_t)123));
#endif
}